

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsBoxes(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  uint nCapMin;
  int iVar4;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x6d,"Vec_Ptr_t *Abc_NtkDfsBoxes(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    nCapMin = pNtk->vObjs->nSize + 500;
    Vec_IntGrow(&pNtk->vTravIds,nCapMin);
    uVar1 = 0;
    uVar3 = 0;
    if (0 < (int)nCapMin) {
      uVar3 = (ulong)nCapMin;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      (pNtk->vTravIds).pArray[uVar1] = 0;
    }
    (pNtk->vTravIds).nSize = nCapMin;
  }
  iVar4 = pNtk->nTravIds;
  pNtk->nTravIds = iVar4 + 1;
  if (iVar4 < 0x3fffffff) {
    vNodes = Vec_PtrAlloc(100);
    for (iVar4 = 0; iVar4 < pNtk->vPos->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar4);
      pAVar2 = Abc_ObjFaninReal(pAVar2,0);
      Abc_NtkDfsBoxes_rec(pAVar2,vNodes);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsBoxes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsBoxes_rec( Abc_ObjFaninReal(pObj, 0), vNodes );
    return vNodes;
}